

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O3

void __thiscall OpenMD::EAM::calcForce(EAM *this,InteractionData *idat)

{
  pointer pEVar1;
  undefined8 uVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  pointer piVar6;
  pointer pEVar7;
  CubicSpline *pCVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  RealType RVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint i;
  long lVar13;
  uint i_1;
  undefined8 *puVar14;
  long lVar15;
  EAMMixingMethod EVar16;
  long lVar17;
  long lVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  RealType dvpdr;
  RealType phab;
  RealType rhb;
  RealType rha;
  RealType drhb;
  RealType drha;
  RealType dphb;
  RealType phb;
  RealType dpha;
  RealType pha;
  Vector<double,_3U> result;
  RealType local_170;
  RealType local_168;
  RealType *local_160;
  double local_158;
  pointer local_150;
  RealType local_148;
  RealType local_140;
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  RealType local_118;
  RealType local_110;
  RealType local_108;
  RealType local_100;
  RealType local_f8;
  RealType local_f0;
  double local_e8;
  double dStack_e0;
  double local_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  RealType local_a8;
  double local_a0;
  double local_98;
  double dStack_90;
  RealType local_88;
  double dStack_80;
  double local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  double local_50;
  double local_48;
  double dStack_40;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  dVar22 = idat->rij;
  if ((this->haveCutoffRadius_ == true) && (this->eamRcut_ <= dVar22 && dVar22 != this->eamRcut_)) {
    return;
  }
  piVar6 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar7 = (this->EAMdata).
           super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar17 = (long)piVar6[idat->atid1];
  lVar15 = (long)piVar6[idat->atid2];
  local_150 = pEVar7 + lVar17;
  pEVar1 = pEVar7 + lVar15;
  local_a0 = pEVar7[lVar17].rcut;
  local_a8 = pEVar7[lVar15].rcut;
  local_e8 = (double)(lVar17 * 3);
  lVar18 = lVar15 * 0x40;
  local_158 = *(double *)
               (*(long *)&(this->MixingMap).
                          super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar17].
                          super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                          ._M_impl.super__Vector_impl_data + 0x30 + lVar18);
  lVar13 = 0;
  local_140 = 0.0;
  local_110 = 0.0;
  local_148 = 0.0;
  local_118 = 0.0;
  local_f0 = 0.0;
  local_f8 = 0.0;
  local_100 = 0.0;
  local_108 = 0.0;
  local_168 = 0.0;
  local_170 = 0.0;
  local_160 = &idat->rij;
  local_78 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  do {
    (&local_88)[lVar13] = (idat->d).super_Vector<double,_3U>.data_[lVar13] / dVar22;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  (this->rhat).super_Vector<double,_3U>.data_[2] = local_78;
  (this->rhat).super_Vector<double,_3U>.data_[0] = local_88;
  (this->rhat).super_Vector<double,_3U>.data_[1] = dStack_80;
  if ((*local_160 < local_a0) && (*local_160 < local_158)) {
    CubicSpline::getValueAndDerivativeAt
              ((local_150->rho).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,local_160,&local_140,&local_110);
    lVar13 = *(long *)((long)&(((this->MixingMap).
                                super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                              )._M_impl.super__Vector_impl_data + (long)local_e8 * 8);
    pCVar8 = *(CubicSpline **)(lVar13 + lVar17 * 0x40);
    p_Var9 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar13 + 8 + lVar17 * 0x40);
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      }
    }
    CubicSpline::getValueAndDerivativeAt(pCVar8,local_160,&local_f0,&local_f8);
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    }
  }
  if ((*local_160 < local_a8) && (*local_160 < local_158)) {
    CubicSpline::getValueAndDerivativeAt
              ((pEVar1->rho).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,local_160,&local_148,&local_118);
    lVar13 = *(long *)&(this->MixingMap).
                       super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar15].
                       super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                       ._M_impl.super__Vector_impl_data;
    pCVar8 = *(CubicSpline **)(lVar13 + lVar18);
    p_Var9 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar13 + 8 + lVar18);
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      }
    }
    CubicSpline::getValueAndDerivativeAt(pCVar8,local_160,&local_100,&local_108);
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    }
  }
  bVar4 = local_150->isFluctuatingCharge;
  bVar5 = pEVar1->isFluctuatingCharge;
  lVar13 = *(long *)((long)&(((this->MixingMap).
                              super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                            )._M_impl.super__Vector_impl_data + (long)local_e8 * 8);
  puVar14 = (undefined8 *)(lVar13 + lVar18);
  if ((bVar4 == false) && ((bVar5 & 1U) == 0)) {
    local_98 = 0.0;
    dStack_90 = 0.0;
    if (*local_160 <= local_158 && local_158 != *local_160) {
      pCVar8 = (CubicSpline *)*puVar14;
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar14[1];
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        }
      }
      CubicSpline::getValueAndDerivativeAt(pCVar8,local_160,&local_168,&local_170);
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
      }
    }
    dStack_b0 = 0.0;
    local_b8 = 0.0;
    dVar21 = 1.0;
    dVar23 = 1.0;
LAB_0025a0a9:
    dStack_e0 = 0.0;
    local_e8 = 0.0;
    local_c8 = 0.0;
    dStack_c0 = 0.0;
    goto LAB_0025a741;
  }
  if (bVar4 == false) {
    local_128 = 1.0;
    dStack_120 = 0.0;
    local_98 = 0.0;
    dStack_90 = 0.0;
  }
  else {
    local_98 = local_150->nValence;
    dStack_90 = local_150->nMobile;
    dVar22 = idat->flucQ1;
    if (this->mixMeth_ == eamDream2) {
      local_128 = 0.0;
      dStack_120 = 0.0;
      if (dVar22 < local_98) {
        if (-dStack_90 < dVar22) {
          dStack_120 = (local_98 + dStack_90) * local_98 * local_98;
          local_128 = ((dStack_90 + dVar22 + local_98) * (dVar22 - local_98) * (dVar22 - local_98))
                      / dStack_120;
        }
        else {
          local_128 = (dStack_90 + local_98) / local_98;
          dStack_120 = dStack_90;
        }
      }
    }
    else {
      local_128 = (local_98 - dVar22) / local_98;
      dStack_120 = dStack_90;
    }
  }
  local_48 = dStack_90;
  dStack_40 = dStack_90;
  if ((bVar5 & 1U) == 0) {
    EVar16 = this->mixMeth_;
    local_138 = 1.0;
    dStack_130 = 0.0;
    local_b8 = 0.0;
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
LAB_00259d77:
    uStack_60 = (double)CONCAT44(local_68._4_4_,(undefined4)local_68);
    dStack_b0 = dStack_130;
    if ((EVar16 & ~eamDream1) == eamJohnson) {
      dVar22 = *local_160;
      if ((dVar22 < local_a0) && (dVar22 < local_158)) {
        dVar21 = (local_138 / local_128) * 0.5;
        local_168 = dVar21 * (local_148 / local_140) * local_f0 + local_168;
        auVar33._8_8_ = (local_110 * local_148) / local_140;
        auVar33._0_8_ = local_118;
        auVar30._8_8_ = local_140;
        auVar30._0_8_ = local_140;
        auVar30 = divpd(auVar33,auVar30);
        local_170 = ((local_148 / local_140) * local_f8 + (auVar30._0_8_ - auVar30._8_8_) * local_f0
                    ) * dVar21 + local_170;
        if (bVar4 != false) {
          idat->dVdFQ1 = (local_f0 * local_148 * local_138 * 0.5) /
                         (local_128 * local_128 * local_140 * dStack_90) + idat->dVdFQ1;
        }
        if ((bVar5 & 1U) != 0) {
          idat->dVdFQ2 = (local_148 * local_f0 * -0.5) / (local_140 * local_68 * local_128) +
                         idat->dVdFQ2;
        }
      }
      dVar21 = local_138;
      dVar23 = local_128;
      if ((dVar22 < local_a8) && (dVar22 < local_158)) {
        dVar22 = (local_128 / local_138) * 0.5;
        local_168 = dVar22 * (local_140 / local_148) * local_100 + local_168;
        auVar32._8_8_ = (local_118 * local_140) / local_148;
        auVar32._0_8_ = local_110;
        auVar28._8_8_ = local_148;
        auVar28._0_8_ = local_148;
        auVar30 = divpd(auVar32,auVar28);
        local_170 = ((local_140 / local_148) * local_108 +
                    (auVar30._0_8_ - auVar30._8_8_) * local_100) * dVar22 + local_170;
        if (bVar4 != false) {
          idat->dVdFQ1 = (local_140 * local_100 * -0.5) / (dStack_90 * local_148 * local_138) +
                         idat->dVdFQ1;
        }
        if ((bVar5 & 1U) != 0) {
          idat->dVdFQ2 = (local_100 * local_140 * local_128 * 0.5) /
                         (local_138 * local_138 * local_148 * local_68) + idat->dVdFQ2;
          goto LAB_0025a0a9;
        }
      }
      dStack_e0 = 0.0;
      local_e8 = 0.0;
      local_c8 = 0.0;
      dStack_c0 = 0.0;
      goto LAB_0025a741;
    }
  }
  else {
    local_b8 = pEVar1->nValence;
    dStack_b0 = pEVar1->nMobile;
    EVar16 = this->mixMeth_;
    dVar22 = idat->flucQ2;
    if (EVar16 != eamDream2) {
      local_138 = (local_b8 - dVar22) / local_b8;
      local_68._0_4_ = SUB84(dStack_b0,0);
      local_68._4_4_ = (undefined4)((ulong)dStack_b0 >> 0x20);
      dStack_130 = dStack_b0;
      goto LAB_00259d77;
    }
    local_138 = 0.0;
    dStack_130 = 0.0;
    uStack_60 = dStack_b0;
    if (dVar22 < local_b8) {
      if (dVar22 <= -dStack_b0) {
        local_138 = (dStack_b0 + local_b8) / local_b8;
        dStack_130 = dStack_b0;
      }
      else {
        dStack_130 = (local_b8 + dStack_b0) * local_b8 * local_b8;
        local_138 = ((dStack_b0 + dVar22 + local_b8) * (dVar22 - local_b8) * (dVar22 - local_b8)) /
                    dStack_130;
      }
    }
  }
  dVar22 = *local_160;
  local_68 = uStack_60;
  if (*(char *)(lVar13 + 0x38 + lVar18) == '\0') {
    if ((dVar22 < local_a0) && (dVar22 < local_158)) {
      pCVar8 = (local_150->phiCC).
               super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var9 = (local_150->phiCC).
               super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        }
      }
      CubicSpline::getValueAndDerivativeAt(pCVar8,local_160,&local_f0,&local_f8);
      local_168 = (local_148 / local_140) * 0.5 * local_f0 + local_168;
      auVar24._8_8_ = (local_148 * local_110) / local_140;
      auVar24._0_8_ = local_118;
      auVar11._8_8_ = local_140;
      auVar11._0_8_ = local_140;
      auVar30 = divpd(auVar24,auVar11);
      local_170 = ((local_148 / local_140) * local_f8 + (auVar30._0_8_ - auVar30._8_8_) * local_f0)
                  * 0.5 + local_170;
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
      }
    }
    local_50 = 1.0;
    if ((local_a8 <= *local_160) || (local_158 <= *local_160)) {
      uVar19 = 0;
      uVar20 = 0x3ff00000;
      goto LAB_0025a2da;
    }
    pCVar8 = (pEVar1->phiCC).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var9 = (pEVar1->phiCC).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      }
    }
    CubicSpline::getValueAndDerivativeAt(pCVar8,local_160,&local_100,&local_108);
    local_168 = (local_140 / local_148) * 0.5 * local_100 + local_168;
    auVar25._8_8_ = (local_140 * local_118) / local_148;
    auVar25._0_8_ = local_110;
    auVar12._8_8_ = local_148;
    auVar12._0_8_ = local_148;
    auVar30 = divpd(auVar25,auVar12);
    local_170 = ((local_140 / local_148) * local_108 + (auVar30._0_8_ - auVar30._8_8_) * local_100)
                * 0.5 + local_170;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    }
    local_d0 = 1.0;
  }
  else {
    if (dVar22 < local_158) {
      pCVar8 = (CubicSpline *)*puVar14;
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar14[1];
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        }
      }
      CubicSpline::getValueAndDerivativeAt(pCVar8,local_160,&local_168,&local_170);
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
      }
    }
    lVar13 = *(long *)((long)&(((this->MixingMap).
                                super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                              )._M_impl.super__Vector_impl_data + (long)local_e8 * 8);
    local_50 = *(double *)(lVar13 + 0x20 + lVar18);
    uVar2 = *(undefined8 *)(lVar13 + 0x28 + lVar18);
    uVar19 = (undefined4)uVar2;
    uVar20 = (undefined4)((ulong)uVar2 >> 0x20);
LAB_0025a2da:
    local_d0 = (double)CONCAT44(uVar20,uVar19);
  }
  local_c8 = 0.0;
  dStack_c0 = 0.0;
  local_e8 = 0.0;
  dStack_e0 = 0.0;
  if (((local_150->isFluctuatingCharge == true) && (dVar22 = idat->flucQ1, dVar22 < local_98)) &&
     (-local_48 < dVar22)) {
    local_e8 = ((local_48 + local_48 + dVar22 * 3.0 + local_98) * (dVar22 - local_98)) /
               (local_98 * local_98 * (local_98 + local_48));
    dStack_e0 = dStack_40;
  }
  if (((pEVar1->isFluctuatingCharge == true) && (dVar22 = idat->flucQ2, dVar22 < local_b8)) &&
     (-local_68 < dVar22)) {
    local_c8 = ((local_68 + local_68 + dVar22 * 3.0 + local_b8) * (dVar22 - local_b8)) /
               (local_b8 * local_b8 * (local_b8 + local_68));
    dStack_c0 = uStack_60;
  }
  if ((*local_160 < local_a0) && (*local_160 < local_158)) {
    pCVar8 = (local_150->phiCV).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var9 = (local_150->phiCV).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      }
    }
    CubicSpline::getValueAndDerivativeAt(pCVar8,local_160,&local_f0,&local_f8);
    dVar21 = local_138 * 0.5 * local_50;
    dVar22 = local_148 / local_140;
    auVar29._8_8_ = (local_148 * local_110) / local_140;
    auVar29._0_8_ = local_118;
    auVar26._8_8_ = local_140;
    auVar26._0_8_ = local_140;
    auVar30 = divpd(auVar29,auVar26);
    local_168 = dVar21 * dVar22 * local_f0 + local_168;
    local_170 = (local_f8 * dVar22 + (auVar30._0_8_ - auVar30._8_8_) * local_f0) * dVar21 +
                local_170;
    if (pEVar1->isFluctuatingCharge == true) {
      idat->dVdFQ2 = local_50 * local_c8 * 0.5 * dVar22 * local_f0 + idat->dVdFQ2;
    }
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    }
  }
  dVar21 = local_138;
  dVar23 = local_128;
  if ((*local_160 < local_a8) && (*local_160 < local_158)) {
    pCVar8 = (pEVar1->phiCV).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var9 = (pEVar1->phiCV).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
      }
    }
    CubicSpline::getValueAndDerivativeAt(pCVar8,local_160,&local_100,&local_108);
    dVar21 = local_128 * 0.5 * local_d0;
    dVar22 = local_140 / local_148;
    auVar31._8_8_ = (local_140 * local_118) / local_148;
    auVar31._0_8_ = local_110;
    auVar27._8_8_ = local_148;
    auVar27._0_8_ = local_148;
    auVar30 = divpd(auVar31,auVar27);
    local_168 = dVar21 * dVar22 * local_100 + local_168;
    local_170 = (local_108 * dVar22 + (auVar30._0_8_ - auVar30._8_8_) * local_100) * dVar21 +
                local_170;
    if (local_150->isFluctuatingCharge == true) {
      idat->dVdFQ1 = local_d0 * local_e8 * 0.5 * dVar22 * local_100 + idat->dVdFQ1;
    }
    dVar21 = local_138;
    dVar23 = local_128;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
      dVar21 = local_138;
      dVar23 = local_128;
    }
  }
LAB_0025a741:
  dVar22 = idat->dfrho2;
  dVar3 = idat->dfrho1;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_78 = 0.0;
  lVar13 = 0;
  do {
    (&local_88)[lVar13] =
         (this->rhat).super_Vector<double,_3U>.data_[lVar13] *
         (dVar21 * local_118 * dVar3 + dVar23 * local_110 * dVar22 + local_170);
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  lVar13 = 0;
  do {
    (idat->f1).super_Vector<double,_3U>.data_[lVar13] =
         (&local_88)[lVar13] + (idat->f1).super_Vector<double,_3U>.data_[lVar13];
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  if (idat->doParticlePot == true) {
    local_88 = idat->rho2 - local_140;
    RVar10 = CubicSpline::getValueAt
                       ((pEVar1->F).
                        super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &local_88);
    idat->particlePot1 = (RVar10 - idat->frho2) + idat->particlePot1;
    local_88 = idat->rho1 - local_148;
    RVar10 = CubicSpline::getValueAt
                       ((local_150->F).
                        super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &local_88);
    idat->particlePot2 = (RVar10 - idat->frho1) + idat->particlePot2;
  }
  (idat->pot).data_[4] = (idat->pot).data_[4] + local_168;
  if (idat->isSelected == true) {
    (idat->selePot).data_[4] = (idat->selePot).data_[4] + local_168;
  }
  idat->vpair = local_168 + idat->vpair;
  if (local_150->isFluctuatingCharge == true) {
    dVar22 = idat->dfrho2 * local_140;
    if (this->mixMeth_ == eamDream2) {
      idat->dVdFQ1 = dVar22 * local_e8 + idat->dVdFQ1;
    }
    else {
      idat->dVdFQ1 = idat->dVdFQ1 - dVar22 / local_98;
    }
  }
  if (pEVar1->isFluctuatingCharge == true) {
    dVar22 = idat->dfrho1 * local_148;
    if (this->mixMeth_ == eamDream2) {
      idat->dVdFQ2 = dVar22 * local_c8 + idat->dVdFQ2;
    }
    else {
      idat->dVdFQ2 = idat->dVdFQ2 - dVar22 / local_b8;
    }
  }
  return;
}

Assistant:

void EAM::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    if (haveCutoffRadius_)
      if (idat.rij > eamRcut_) return;

    int eamtid1        = EAMtids[idat.atid1];
    int eamtid2        = EAMtids[idat.atid2];
    EAMAtomData& data1 = EAMdata[eamtid1];
    EAMAtomData& data2 = EAMdata[eamtid2];

    // get type-specific cutoff radii

    RealType rci  = data1.rcut;
    RealType rcj  = data2.rcut;
    RealType rcij = MixingMap[eamtid1][eamtid2].rcut;

    RealType rha(0.0), drha(0.0), rhb(0.0), drhb(0.0);
    RealType pha(0.0), dpha(0.0), phb(0.0), dphb(0.0);

    RealType phab(0.0), dvpdr(0.0);
    RealType drhoidr(0.0), drhojdr(0.0), dudr(0.0);
    // For DREAM, we need nValence (Va, Vb), nMobile (Ma, Mb), for
    // each type, and density scaling variables (si, sj) for each atom:
    RealType Va(0.0), Vb(0.0);
    RealType Ma(0.0), Mb(0.0);
    RealType si(1.0), sj(1.0);
    RealType sip(0.0), sjp(0.0);
    RealType Ci(1.0), Cj(1.0);

    rhat = idat.d / idat.rij;
    if (idat.rij < rci && idat.rij < rcij) {
      data1.rho->getValueAndDerivativeAt(idat.rij, rha, drha);
      CubicSplinePtr phi = MixingMap[eamtid1][eamtid1].phi;
      phi->getValueAndDerivativeAt(idat.rij, pha, dpha);
    }

    if (idat.rij < rcj && idat.rij < rcij) {
      data2.rho->getValueAndDerivativeAt(idat.rij, rhb, drhb);
      CubicSplinePtr phi = MixingMap[eamtid2][eamtid2].phi;
      phi->getValueAndDerivativeAt(idat.rij, phb, dphb);
    }

    bool hasFlucQ   = data1.isFluctuatingCharge || data2.isFluctuatingCharge;
    bool isExplicit = MixingMap[eamtid1][eamtid2].explicitlySet;
    if (hasFlucQ) {
      if (data1.isFluctuatingCharge) {
        Va = data1.nValence;
        Ma = data1.nMobile;
        if (mixMeth_ == eamDream2)
          si = gFunc(idat.flucQ1, Va, Ma);
        else
          si = (Va - idat.flucQ1) / Va;
      }
      if (data2.isFluctuatingCharge) {
        Vb = data2.nValence;
        Mb = data2.nMobile;
        if (mixMeth_ == eamDream2)
          sj = gFunc(idat.flucQ2, Vb, Mb);
        else
          sj = (Vb - idat.flucQ2) / Vb;
      }

      if (mixMeth_ == eamJohnson || mixMeth_ == eamDream1) {
        if (idat.rij < rci && idat.rij < rcij) {
          phab  = phab + 0.5 * (sj / si) * (rhb / rha) * pha;
          dvpdr = dvpdr + 0.5 * (sj / si) *
                              ((rhb / rha) * dpha +
                               pha * ((drhb / rha) - (rhb * drha / rha / rha)));

          if (data1.isFluctuatingCharge) {
            idat.dVdFQ1 += 0.5 * (rhb * sj * pha) / (rha * Ma * si * si);
          }
          if (data2.isFluctuatingCharge) {
            idat.dVdFQ2 -= 0.5 * (rhb * pha) / (rha * Mb * si);
          }
        }

        if (idat.rij < rcj && idat.rij < rcij) {
          phab  = phab + 0.5 * (si / sj) * (rha / rhb) * phb;
          dvpdr = dvpdr + 0.5 * (si / sj) *
                              ((rha / rhb) * dphb +
                               phb * ((drha / rhb) - (rha * drhb / rhb / rhb)));

          if (data1.isFluctuatingCharge) {
            idat.dVdFQ1 -= 0.5 * (rha * phb) / (rhb * Ma * sj);
          }
          if (data2.isFluctuatingCharge) {
            idat.dVdFQ2 += 0.5 * (rha * si * phb) / (rhb * Mb * sj * sj);
          }
        }
      } else {
        if (isExplicit) {
          // phi is total potential for EAMTable and EAMZhou but CC interaction
          // for EAMOxide potential
          bool insideCutOff = (idat.rij < rcij);
          if (insideCutOff) {
            CubicSplinePtr phi = MixingMap[eamtid1][eamtid2].phi;
            phi->getValueAndDerivativeAt(idat.rij, phab, dvpdr);
          }

        } else {
          // Core-Core part first - no fluctuating charge, just Johnson mixing:

          if (idat.rij < rci && idat.rij < rcij) {
            CubicSplinePtr phiACC = data1.phiCC;
            phiACC->getValueAndDerivativeAt(idat.rij, pha, dpha);
            phab += 0.5 * (rhb / rha) * pha;
            dvpdr += 0.5 * ((rhb / rha) * dpha +
                            pha * ((drhb / rha) - (rhb * drha / rha / rha)));
          }
          if (idat.rij < rcj && idat.rij < rcij) {
            CubicSplinePtr phiBCC = data2.phiCC;
            phiBCC->getValueAndDerivativeAt(idat.rij, phb, dphb);
            phab += 0.5 * (rha / rhb) * phb;
            dvpdr += 0.5 * ((rha / rhb) * dphb +
                            phb * ((drha / rhb) - (rha * drhb / rhb / rhb)));
          }
        }

        if (isExplicit) {
          // Ci, Cj are 0 for EAMTable and EAMZhou. So, there is no CV
          // interaction
          Ci = MixingMap[eamtid1][eamtid2].Ci;
          Cj = MixingMap[eamtid1][eamtid2].Cj;
        }
        // Core-Valence next, this does include fluctuating charges:

        if (data1.isFluctuatingCharge) { sip = gPrime(idat.flucQ1, Va, Ma); }
        if (data2.isFluctuatingCharge) { sjp = gPrime(idat.flucQ2, Vb, Mb); }

        if (idat.rij < rci && idat.rij < rcij) {
          CubicSplinePtr phiACV = data1.phiCV;
          phiACV->getValueAndDerivativeAt(idat.rij, pha, dpha);

          phab += 0.5 * sj * Ci * (rhb / rha) * pha;
          dvpdr += 0.5 * sj * Ci *
                   ((rhb / rha) * dpha +
                    pha * ((drhb / rha) - (rhb * drha / rha / rha)));

          if (data2.isFluctuatingCharge) {
            idat.dVdFQ2 += 0.5 * sjp * Ci * (rhb / rha) * pha;
          }
        }
        if (idat.rij < rcj && idat.rij < rcij) {
          CubicSplinePtr phiBCV = data2.phiCV;
          phiBCV->getValueAndDerivativeAt(idat.rij, phb, dphb);

          phab += 0.5 * si * Cj * (rha / rhb) * phb;
          dvpdr += 0.5 * si * Cj *
                   ((rha / rhb) * dphb +
                    phb * ((drha / rhb) - (rha * drhb / rhb / rhb)));

          if (data1.isFluctuatingCharge) {
            idat.dVdFQ1 += 0.5 * sip * Cj * (rha / rhb) * phb;
          }
        }
      }
    } else {
      if (idat.rij < rcij) {
        CubicSplinePtr phi = MixingMap[eamtid1][eamtid2].phi;
        phi->getValueAndDerivativeAt(idat.rij, phab, dvpdr);
      }
    }
    drhoidr = si * drha;
    drhojdr = sj * drhb;
    dudr    = drhojdr * idat.dfrho1 + drhoidr * idat.dfrho2 + dvpdr;

    idat.f1 += rhat * dudr;

    if (idat.doParticlePot) {
      // particlePot is the difference between the full potential and
      // the full potential without the presence of a particular
      // particle (atom1).
      //
      // This reduces the density at other particle locations, so we
      // need to recompute the density at atom2 assuming atom1 didn't
      // contribute.  This then requires recomputing the density
      // functional for atom2 as well.

      idat.particlePot1 += data2.F->getValueAt(idat.rho2 - rha) - idat.frho2;

      idat.particlePot2 += data1.F->getValueAt(idat.rho1 - rhb) - idat.frho1;
    }

    idat.pot[METALLIC_PAIR_FAMILY] += phab;
    if (idat.isSelected) idat.selePot[METALLIC_PAIR_FAMILY] += phab;

    idat.vpair += phab;

    // When densities are fluctuating, the functional depends on the
    // fluctuating densities from other sites:
    if (data1.isFluctuatingCharge) {
      if (mixMeth_ == eamDream2)
        idat.dVdFQ1 += idat.dfrho2 * rha * sip;
      else
        idat.dVdFQ1 -= idat.dfrho2 * rha / Va;
    }
    if (data2.isFluctuatingCharge) {
      if (mixMeth_ == eamDream2)
        idat.dVdFQ2 += idat.dfrho1 * rhb * sjp;
      else
        idat.dVdFQ2 -= idat.dfrho1 * rhb / Vb;
    }

    return;
  }